

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  size_t sVar5;
  long lVar6;
  PolicyID id;
  char *pcVar7;
  string ndefs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defs;
  char *define;
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  char *local_30;
  
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar3 != 0)) {
    ParseDefineFlag::valid.program = (char *)0x0;
    cmsys::RegularExpression::compile(&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$")
    ;
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  bVar2 = cmsys::RegularExpression::find(&ParseDefineFlag::valid,(def->_M_dataplus)._M_p);
  if (bVar2) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_90);
    iVar3 = std::__cxx11::string::compare(local_90);
    if ((iVar3 == 0) && (lVar6 = std::__cxx11::string::find((char *)def,0x4ced17,0), lVar6 != -1)) {
      lVar6 = std::__cxx11::string::find_first_of((char *)def,0x4e0aee,0);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
      }
      if (lVar6 != -1) {
        return false;
      }
    }
    else if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
             (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
    }
    if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
       (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
       iVar3 != 0)) {
      ParseDefineFlag::trivial.program = (char *)0x0;
      cmsys::RegularExpression::compile
                (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                   &__dso_handle);
      __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
    }
    bVar2 = cmsys::RegularExpression::find(&ParseDefineFlag::trivial,(def->_M_dataplus)._M_p);
    if (bVar2) {
LAB_00395b2d:
      pcVar7 = (def->_M_dataplus)._M_p + 2;
      local_30 = pcVar7;
      if (remove) {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68 + 0x10);
        local_68._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"COMPILE_DEFINITIONS","")
        ;
        cmState::Snapshot::GetDirectory((Directory *)local_90,&this->StateSnapshot);
        pcVar7 = cmState::Directory::GetProperty((Directory *)local_90,(string *)local_68);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
            pbVar1) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        if (pcVar7 != (char *)0x0) {
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_90._0_8_ = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80;
          sVar5 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,pcVar7,pcVar7 + sVar5);
          cmSystemTools::ExpandListArgument((string *)local_90,&local_48,false);
          if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
              (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
          }
          local_68._8_8_ =
               std::
               __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                         ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_48.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_48.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_equals_val<const_char_*const>)&local_30);
          local_68._0_8_ =
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ((string *)local_90,
                     (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_68,";");
          local_68._0_8_ = pbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"COMPILE_DEFINITIONS","");
          SetProperty(this,(string *)local_68,(char *)local_90._0_8_);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
              pbVar1) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
          if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
              (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      else {
        local_90._0_8_ = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"COMPILE_DEFINITIONS","")
        ;
        AppendProperty(this,(string *)local_90,pcVar7,false);
        if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
            (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
        }
      }
      return true;
    }
    PVar4 = cmState::Snapshot::GetPolicy(&this->StateSnapshot,CMP0005);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_90,(cmPolicies *)0x5,id);
      IssueMessage(this,FATAL_ERROR,(string *)local_90,false);
    }
    else {
      if (PVar4 == OLD) {
        return false;
      }
      if (PVar4 != WARN) goto LAB_00395b2d;
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_90,(cmPolicies *)0x5,id);
      IssueMessage(this,AUTHOR_WARNING,(string *)local_90,false);
    }
    if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_90._0_8_ !=
        (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
    }
  }
  return false;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression
    valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if(!valid.find(def.c_str()))
    {
    return false;
    }

  // VS6 IDE does not support definition values with spaces in
  // combination with '"', '$', or ';'.
  if((this->GetGlobalGenerator()->GetName() == "Visual Studio 6") &&
     (def.find(" ") != def.npos && def.find_first_of("\"$;") != def.npos))
    {
    return false;
    }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression
    trivial("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if(!trivial.find(def.c_str()))
    {
    // This definition has a non-trivial value.
    switch(this->GetPolicyStatus(cmPolicies::CMP0005))
      {
      case cmPolicies::WARN:
        this->IssueMessage(
          cmake::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0005)
          );
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005)
          );
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
      }
    }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if(remove)
    {
    if(const char* cdefs = this->GetProperty("COMPILE_DEFINITIONS"))
      {
      // Expand the list.
      std::vector<std::string> defs;
      cmSystemTools::ExpandListArgument(cdefs, defs);

      // Recompose the list without the definition.
      std::vector<std::string>::const_iterator defEnd =
          std::remove(defs.begin(), defs.end(), define);
      std::vector<std::string>::const_iterator defBegin =
          defs.begin();
      std::string ndefs = cmJoin(cmMakeRange(defBegin, defEnd), ";");

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", ndefs.c_str());
      }
    }
  else
    {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
    }

  return true;
}